

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxGetClass::Resolve(FxGetClass *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PClassPointer *pPVar3;
  FxExpression *this_00;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar2 = (*this->Self->_vptr_FxExpression[2])();
    this_00 = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Self = this_00;
    if (this_00 != (FxExpression *)0x0) {
      bVar1 = FxExpression::IsObject(this_00);
      if (bVar1) {
        pPVar3 = NewClassPointer((PClass *)
                                 this->Self->ValueType[1].super_PTypeBase.super_DObject.
                                 _vptr_DObject);
        (this->super_FxExpression).ValueType = (PType *)pPVar3;
        return &this->super_FxExpression;
      }
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"GetClass() requires an object");
    }
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxGetClass::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	if (!Self->IsObject())
	{
		ScriptPosition.Message(MSG_ERROR, "GetClass() requires an object");
		delete this;
		return nullptr;
	}
	ValueType = NewClassPointer(static_cast<PClass*>(static_cast<PPointer*>(Self->ValueType)->PointedType));
	return this;
}